

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O1

void __thiscall
Omega_h::Mesh::set_tag<long>(Mesh *this,Int ent_dim,string *name,Read<long> *array,bool internal)

{
  int *piVar1;
  Alloc *pAVar2;
  int ncomps;
  size_t sVar3;
  Read<long> local_40;
  
  pAVar2 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar3 = pAVar2->size;
  }
  else {
    sVar3 = (ulong)pAVar2 >> 3;
  }
  check_dim2(this,ent_dim);
  ncomps = divide_no_remainder<int>((int)(sVar3 >> 3),this->nents_[ent_dim]);
  local_40.write_.shared_alloc_.alloc = (array->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.direct_ptr = (array->write_).shared_alloc_.direct_ptr;
  add_tag<long>(this,ent_dim,name,ncomps,&local_40,internal);
  pAVar2 = local_40.write_.shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

void Mesh::set_tag(
    Int ent_dim, std::string const& name, Read<T> array, bool internal) {
  this->add_tag(ent_dim, name, divide_no_remainder(array.size(), nents(ent_dim)), array, internal);
}